

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTable(SharedValidator *this,Location *loc,Type elem_type,Limits *limits)

{
  bool bVar1;
  Enum EVar2;
  size_type sVar3;
  TableType local_60;
  Enum local_3c;
  Enum local_38;
  Enum local_34;
  Enum local_30;
  Enum local_2c;
  Limits *local_28;
  Limits *limits_local;
  Location *loc_local;
  SharedValidator *this_local;
  Type elem_type_local;
  Result result;
  
  local_28 = limits;
  limits_local = (Limits *)loc;
  loc_local = (Location *)this;
  this_local._0_4_ = elem_type.enum_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  sVar3 = std::
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          ::size(&this->tables_);
  if (sVar3 != 0) {
    bVar1 = Features::reference_types_enabled((Features *)this);
    if (!bVar1) {
      local_2c = (Enum)PrintError(this,(Location *)limits_local,"only one table allowed");
      Result::operator|=((Result *)((long)&this_local + 4),(Result)local_2c);
    }
  }
  local_30 = (Enum)CheckLimits(this,(Location *)limits_local,local_28,0xffffffff,"elems");
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
  if ((local_28->is_shared & 1U) != 0) {
    local_34 = (Enum)PrintError(this,(Location *)limits_local,"tables may not be shared");
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_34);
  }
  EVar2 = Type::operator_cast_to_Enum((Type *)&this_local);
  if (EVar2 != FuncRef) {
    bVar1 = Features::reference_types_enabled((Features *)this);
    if (!bVar1) {
      local_38 = (Enum)PrintError(this,(Location *)limits_local,"tables must have funcref type");
      Result::operator|=((Result *)((long)&this_local + 4),(Result)local_38);
    }
  }
  bVar1 = Type::IsRef((Type *)&this_local);
  if (!bVar1) {
    local_3c = (Enum)PrintError(this,(Location *)limits_local,"tables must have reference types");
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_3c);
  }
  TableType::TableType(&local_60,this_local._0_4_,*local_28);
  std::vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>::
  push_back(&this->tables_,&local_60);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnTable(const Location& loc,
                                Type elem_type,
                                const Limits& limits) {
  Result result = Result::Ok;
  if (tables_.size() > 0 && !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "only one table allowed");
  }
  result |= CheckLimits(loc, limits, UINT32_MAX, "elems");

  if (limits.is_shared) {
    result |= PrintError(loc, "tables may not be shared");
  }
  if (elem_type != Type::FuncRef &&
      !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "tables must have funcref type");
  }
  if (!elem_type.IsRef()) {
    result |= PrintError(loc, "tables must have reference types");
  }

  tables_.push_back(TableType{elem_type, limits});
  return result;
}